

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O0

void __thiscall
Am_Drawonable_Impl::set_gc_using_fill
          (Am_Drawonable_Impl *this,Am_Style *fill,Am_Draw_Function f,Pixmap image)

{
  int iVar1;
  Am_Fill_Poly_Flag poly_00;
  Am_Wrapper *value;
  Am_Fill_Poly_Flag poly;
  Am_Image_Array local_d0;
  Am_Image_Array fill_stipple;
  Am_Style_Data *fil;
  unsigned_long fore_index;
  ulong uStack_b0;
  Am_Fill_Solid_Flag fill_flag;
  unsigned_long mask;
  XGCValues values;
  Pixmap image_local;
  Am_Draw_Function f_local;
  Am_Style *fill_local;
  Am_Drawonable_Impl *this_local;
  
  uStack_b0 = 0;
  values._120_8_ = image;
  iVar1 = XGetGCValues(this->screen->display,this->screen->gc,Am_GC_getmask,&mask);
  if (iVar1 == 0) {
    Am_Error("** set_gc_using_fill: could not get GC values.\n");
  }
  value = Am_Style::operator_cast_to_Am_Wrapper_(fill);
  fill_stipple.data = (Am_Image_Array_Data *)Am_Style_Data::Narrow(value);
  if ((Am_Style_Data *)fill_stipple.data == (Am_Style_Data *)0x0) {
    fil = (Am_Style_Data *)this->screen->whitepixel;
  }
  else {
    if (f == Am_DRAW_MASK_COPY) {
      fil = (Am_Style_Data *)Am_Style_Data::Get_X_Index(&Am_On_Bits_Data,this);
    }
    else {
      fil = (Am_Style_Data *)Am_Style_Data::Get_X_Index((Am_Style_Data *)fill_stipple.data,this);
    }
    Am_Wrapper::Release(&(fill_stipple.data)->super_Am_Wrapper);
    if (values._120_8_ == 0) {
      Am_Image_Array::Am_Image_Array(&local_d0);
      fore_index._4_4_ = Am_Style::Get_Fill_Flag(fill);
      if ((fore_index._4_4_ == Am_FILL_OPAQUE_STIPPLED) && (f == Am_DRAW_MASK_COPY)) {
        fore_index._4_4_ = Am_FILL_SOLID;
      }
      else {
        Am_Style::Get_Stipple((Am_Style *)&stack0xffffffffffffff18);
        Am_Image_Array::operator=(&local_d0,(Am_Image_Array *)&stack0xffffffffffffff18);
        Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&stack0xffffffffffffff18);
      }
      adjust_gcvalues_stipple
                (this,(XGCValues *)&mask,&stack0xffffffffffffff50,fore_index._4_4_,&local_d0);
      Am_Image_Array::~Am_Image_Array(&local_d0);
    }
    else {
      values.tile._0_4_ = values.dash_offset;
      values.tile._4_1_ = values.dashes;
      values.tile._5_3_ = values._125_3_;
      values.cap_style = 2;
      uStack_b0 = uStack_b0 | 0x900;
    }
    poly_00 = Am_Style::Get_Fill_Poly_Flag(fill);
    set_gcvalues_fill_poly_rule((XGCValues *)&mask,&stack0xffffffffffffff50,poly_00);
  }
  adjust_gcvalues_color_drawfn
            (this,(XGCValues *)&mask,&stack0xffffffffffffff50,(unsigned_long)fil,f);
  if (uStack_b0 != 0) {
    XChangeGC(this->screen->display,this->screen->gc,uStack_b0,&mask);
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::set_gc_using_fill(const Am_Style &fill, Am_Draw_Function f,
                                      Pixmap image) const
{
  XGCValues values;
  unsigned long mask = 0;

  Am_Fill_Solid_Flag fill_flag;
  unsigned long fore_index;

  if (XGetGCValues(screen->display, screen->gc, Am_GC_getmask, &values) == 0)
    Am_Error("** set_gc_using_fill: could not get GC values.\n");

  Am_Style_Data *fil = Am_Style_Data::Narrow(fill);
  if (fil) {
    if (f != Am_DRAW_MASK_COPY)
      fore_index = fil->Get_X_Index(this);
    else
      fore_index = Am_On_Bits_Data.Get_X_Index(this);
    fil->Release();

    // If there is an image, use it for the stipple.  Else, use the
    // image stored in the style.
    if (image) {
      values.stipple = image;
      values.fill_style = FillStippled;
      mask |= GCStipple | GCFillStyle;
    } else {
      Am_Image_Array fill_stipple;
      fill_flag = fill.Get_Fill_Flag();
      if ((fill_flag == Am_FILL_OPAQUE_STIPPLED) && (f == Am_DRAW_MASK_COPY))
        fill_flag = Am_FILL_SOLID;
      else
        fill_stipple = fill.Get_Stipple();
      adjust_gcvalues_stipple(values, mask, fill_flag, fill_stipple);
    }

    Am_Fill_Poly_Flag poly = fill.Get_Fill_Poly_Flag();
    set_gcvalues_fill_poly_rule(values, mask, poly);
  } else {
    fore_index = screen->whitepixel;
  }

  adjust_gcvalues_color_drawfn(values, mask, fore_index, f);
  if (mask) {
    XChangeGC(screen->display, screen->gc, mask, &values);
  }
}